

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UBool __thiscall icu_63::RegexMatcher::find(RegexMatcher *this,UErrorCode *status)

{
  uint uVar1;
  UChar *pUVar2;
  int64_t iVar3;
  UBool UVar4;
  long lVar5;
  int iVar6;
  int64_t local_130;
  uint local_124;
  long local_120;
  uint local_114;
  int64_t local_110;
  uint local_108;
  uint local_104;
  long local_100;
  uint local_f4;
  long local_f0;
  uint local_e4;
  int64_t local_e0;
  uint local_d4;
  int64_t local_d0;
  long local_c0;
  int64_t __offset_10;
  int64_t __offset_9;
  int64_t __offset_8;
  int64_t __offset_7;
  int64_t __offset_6;
  UChar32 ch;
  int64_t __offset_5;
  int64_t pos_1;
  int64_t __offset_4;
  UChar32 theChar;
  int64_t __offset_3;
  int64_t pos;
  int64_t __offset_2;
  int64_t __offset_1;
  long lStack_38;
  UChar32 c;
  int64_t testStartLimit;
  int64_t __offset;
  int64_t startPos;
  UErrorCode *status_local;
  RegexMatcher *this_local;
  
  UVar4 = ::U_FAILURE(*status);
  if (UVar4 == '\0') {
    UVar4 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar4 == '\0') {
      if (((this->fInputText->chunkNativeStart == 0) &&
          (this->fInputLength == this->fInputText->chunkNativeLimit)) &&
         (this->fInputLength == (long)this->fInputText->nativeIndexingLimit)) {
        this_local._7_1_ = findUsingChunk(this,status);
      }
      else {
        __offset = this->fMatchEnd;
        if (__offset == 0) {
          __offset = this->fActiveStart;
        }
        if (this->fMatch == '\0') {
          if (-1 < this->fLastMatchEnd) {
            this->fHitEnd = '\x01';
            return '\0';
          }
        }
        else {
          this->fLastMatchEnd = this->fMatchEnd;
          if (this->fMatchStart == this->fMatchEnd) {
            if (this->fActiveLimit <= __offset) {
              this->fMatch = '\0';
              this->fHitEnd = '\x01';
              return '\0';
            }
            lVar5 = __offset - this->fInputText->chunkNativeStart;
            if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
               (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
              utext_setNativeIndex_63(this->fInputText,__offset);
            }
            else {
              this->fInputText->chunkOffset = (int32_t)lVar5;
            }
            if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
               ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] < 0xd800)) {
              this->fInputText->chunkOffset = this->fInputText->chunkOffset + 1;
            }
            else {
              utext_next32_63(this->fInputText);
            }
            if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
              local_c0 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
            }
            else {
              local_c0 = this->fInputText->chunkNativeStart + (long)this->fInputText->chunkOffset;
            }
            __offset = local_c0;
          }
        }
        if (this->fInputText->pFuncs->mapNativeIndexToUTF16 == (UTextMapNativeIndexToUTF16 *)0x0) {
          lStack_38 = this->fActiveLimit - (long)this->fPattern->fMinMatchLen;
          if (lStack_38 < __offset) {
            this->fMatch = '\0';
            this->fHitEnd = '\x01';
            return '\0';
          }
        }
        else {
          lStack_38 = this->fActiveLimit - (long)(int)(uint)(0 < this->fPattern->fMinMatchLen);
        }
        switch(this->fPattern->fStartType) {
        case 0:
          do {
            MatchAt(this,__offset,'\0',status);
            UVar4 = ::U_FAILURE(*status);
            if (UVar4 != '\0') {
              return '\0';
            }
            if (this->fMatch != '\0') {
              return '\x01';
            }
            if (lStack_38 <= __offset) {
              this->fHitEnd = '\x01';
              return '\0';
            }
            lVar5 = __offset - this->fInputText->chunkNativeStart;
            if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
               (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
              utext_setNativeIndex_63(this->fInputText,__offset);
            }
            else {
              this->fInputText->chunkOffset = (int32_t)lVar5;
            }
            if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
               ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] < 0xd800)) {
              this->fInputText->chunkOffset = this->fInputText->chunkOffset + 1;
            }
            else {
              utext_next32_63(this->fInputText);
            }
            if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
              local_d0 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
            }
            else {
              local_d0 = this->fInputText->chunkNativeStart + (long)this->fInputText->chunkOffset;
            }
            __offset = local_d0;
            UVar4 = findProgressInterrupt(this,local_d0,status);
          } while (UVar4 == '\0');
          this_local._7_1_ = '\0';
          break;
        case 1:
        case 5:
          uVar1 = this->fPattern->fInitialChar;
          lVar5 = __offset - this->fInputText->chunkNativeStart;
          if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
             (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
            utext_setNativeIndex_63(this->fInputText,__offset);
          }
          else {
            this->fInputText->chunkOffset = (int32_t)lVar5;
          }
          do {
            iVar3 = __offset;
            if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
               ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] < 0xd800)) {
              pUVar2 = this->fInputText->chunkContents;
              iVar6 = this->fInputText->chunkOffset;
              this->fInputText->chunkOffset = iVar6 + 1;
              local_e4 = (uint)(ushort)pUVar2[iVar6];
            }
            else {
              local_e4 = utext_next32_63(this->fInputText);
            }
            if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
              local_f0 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
            }
            else {
              local_f0 = this->fInputText->chunkNativeStart + (long)this->fInputText->chunkOffset;
            }
            __offset = local_f0;
            if (local_e4 == uVar1) {
              MatchAt(this,iVar3,'\0',status);
              UVar4 = ::U_FAILURE(*status);
              if (UVar4 != '\0') {
                return '\0';
              }
              if (this->fMatch != '\0') {
                return '\x01';
              }
              lVar5 = local_f0 - this->fInputText->chunkNativeStart;
              if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
                 (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
                utext_setNativeIndex_63(this->fInputText,local_f0);
              }
              else {
                this->fInputText->chunkOffset = (int32_t)lVar5;
              }
            }
            if (lStack_38 < local_f0) {
              this->fMatch = '\0';
              this->fHitEnd = '\x01';
              return '\0';
            }
            UVar4 = findProgressInterrupt(this,local_f0,status);
          } while (UVar4 == '\0');
          this_local._7_1_ = '\0';
          break;
        case 2:
          lVar5 = __offset - this->fInputText->chunkNativeStart;
          if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
             (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
            utext_setNativeIndex_63(this->fInputText,__offset);
          }
          else {
            this->fInputText->chunkOffset = (int32_t)lVar5;
          }
          do {
            iVar3 = __offset;
            if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
               ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] < 0xd800)) {
              pUVar2 = this->fInputText->chunkContents;
              iVar6 = this->fInputText->chunkOffset;
              this->fInputText->chunkOffset = iVar6 + 1;
              local_d4 = (uint)(ushort)pUVar2[iVar6];
            }
            else {
              local_d4 = utext_next32_63(this->fInputText);
            }
            if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
              local_e0 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
            }
            else {
              local_e0 = this->fInputText->chunkNativeStart + (long)this->fInputText->chunkOffset;
            }
            __offset = local_e0;
            if ((-1 < (int)local_d4) &&
               ((((int)local_d4 < 0x100 &&
                 (UVar4 = Regex8BitSet::contains(this->fPattern->fInitialChars8,local_d4),
                 UVar4 != '\0')) ||
                ((0xff < (int)local_d4 &&
                 (UVar4 = UnicodeSet::contains(this->fPattern->fInitialChars,local_d4),
                 UVar4 != '\0')))))) {
              MatchAt(this,iVar3,'\0',status);
              UVar4 = ::U_FAILURE(*status);
              if (UVar4 != '\0') {
                return '\0';
              }
              if (this->fMatch != '\0') {
                return '\x01';
              }
              lVar5 = iVar3 - this->fInputText->chunkNativeStart;
              if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
                 (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
                utext_setNativeIndex_63(this->fInputText,iVar3);
              }
              else {
                this->fInputText->chunkOffset = (int32_t)lVar5;
              }
            }
            if (lStack_38 < local_e0) {
              this->fMatch = '\0';
              this->fHitEnd = '\x01';
              return '\0';
            }
            UVar4 = findProgressInterrupt(this,local_e0,status);
          } while (UVar4 == '\0');
          this_local._7_1_ = '\0';
          break;
        case 3:
          if (this->fActiveStart < __offset) {
            this->fMatch = '\0';
            this_local._7_1_ = '\0';
          }
          else {
            MatchAt(this,__offset,'\0',status);
            UVar4 = ::U_FAILURE(*status);
            if (UVar4 == '\0') {
              this_local._7_1_ = this->fMatch;
            }
            else {
              this_local._7_1_ = '\0';
            }
          }
          break;
        case 4:
          if (__offset == this->fAnchorStart) {
            MatchAt(this,__offset,'\0',status);
            UVar4 = ::U_FAILURE(*status);
            if (UVar4 != '\0') {
              return '\0';
            }
            if (this->fMatch != '\0') {
              return '\x01';
            }
            lVar5 = __offset - this->fInputText->chunkNativeStart;
            if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
               (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
              utext_setNativeIndex_63(this->fInputText,__offset);
            }
            else {
              this->fInputText->chunkOffset = (int32_t)lVar5;
            }
            if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
               ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] < 0xd800)) {
              pUVar2 = this->fInputText->chunkContents;
              iVar6 = this->fInputText->chunkOffset;
              this->fInputText->chunkOffset = iVar6 + 1;
              local_f4 = (uint)(ushort)pUVar2[iVar6];
            }
            else {
              local_f4 = utext_next32_63(this->fInputText);
            }
            __offset_6._4_4_ = local_f4;
            if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
              local_100 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
            }
            else {
              local_100 = this->fInputText->chunkNativeStart + (long)this->fInputText->chunkOffset;
            }
            __offset = local_100;
          }
          else {
            lVar5 = __offset - this->fInputText->chunkNativeStart;
            if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
               (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
              utext_setNativeIndex_63(this->fInputText,__offset);
            }
            else {
              this->fInputText->chunkOffset = (int32_t)lVar5;
            }
            if ((this->fInputText->chunkOffset < 1) ||
               (0xd7ff < (ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset + -1]
               )) {
              local_104 = utext_previous32_63(this->fInputText);
            }
            else {
              pUVar2 = this->fInputText->chunkContents;
              iVar6 = this->fInputText->chunkOffset + -1;
              this->fInputText->chunkOffset = iVar6;
              local_104 = (uint)(ushort)pUVar2[iVar6];
            }
            __offset_6._4_4_ = local_104;
            lVar5 = __offset - this->fInputText->chunkNativeStart;
            if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
               (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
              utext_setNativeIndex_63(this->fInputText,__offset);
            }
            else {
              this->fInputText->chunkOffset = (int32_t)lVar5;
            }
          }
          if ((this->fPattern->fFlags & 1) == 0) {
            do {
              UVar4 = isLineTerminator(__offset_6._4_4_);
              if (UVar4 != '\0') {
                if ((__offset_6._4_4_ == 0xd) && (__offset < this->fActiveLimit)) {
                  if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
                     ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] <
                      0xd800)) {
                    local_114 = (uint)(ushort)this->fInputText->chunkContents
                                              [this->fInputText->chunkOffset];
                  }
                  else {
                    local_114 = utext_current32_63(this->fInputText);
                  }
                  if (local_114 == 10) {
                    if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
                       ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] <
                        0xd800)) {
                      this->fInputText->chunkOffset = this->fInputText->chunkOffset + 1;
                    }
                    else {
                      utext_next32_63(this->fInputText);
                    }
                    if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
                      local_120 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
                    }
                    else {
                      local_120 = this->fInputText->chunkNativeStart +
                                  (long)this->fInputText->chunkOffset;
                    }
                    __offset = local_120;
                  }
                }
                MatchAt(this,__offset,'\0',status);
                UVar4 = ::U_FAILURE(*status);
                if (UVar4 != '\0') {
                  return '\0';
                }
                if (this->fMatch != '\0') {
                  return '\x01';
                }
                lVar5 = __offset - this->fInputText->chunkNativeStart;
                if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
                   (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
                  utext_setNativeIndex_63(this->fInputText,__offset);
                }
                else {
                  this->fInputText->chunkOffset = (int32_t)lVar5;
                }
              }
              if (lStack_38 <= __offset) {
                this->fMatch = '\0';
                this->fHitEnd = '\x01';
                return '\0';
              }
              if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
                 ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] < 0xd800))
              {
                pUVar2 = this->fInputText->chunkContents;
                iVar6 = this->fInputText->chunkOffset;
                this->fInputText->chunkOffset = iVar6 + 1;
                local_124 = (uint)(ushort)pUVar2[iVar6];
              }
              else {
                local_124 = utext_next32_63(this->fInputText);
              }
              __offset_6._4_4_ = local_124;
              if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
                local_130 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
              }
              else {
                local_130 = this->fInputText->chunkNativeStart + (long)this->fInputText->chunkOffset
                ;
              }
              __offset = local_130;
              UVar4 = findProgressInterrupt(this,local_130,status);
            } while (UVar4 == '\0');
            this_local._7_1_ = '\0';
          }
          else {
            do {
              if (__offset_6._4_4_ == 10) {
                MatchAt(this,__offset,'\0',status);
                UVar4 = ::U_FAILURE(*status);
                if (UVar4 != '\0') {
                  return '\0';
                }
                if (this->fMatch != '\0') {
                  return '\x01';
                }
                lVar5 = __offset - this->fInputText->chunkNativeStart;
                if (((lVar5 < 0) || (this->fInputText->nativeIndexingLimit <= lVar5)) ||
                   (0xdbff < (ushort)this->fInputText->chunkContents[lVar5])) {
                  utext_setNativeIndex_63(this->fInputText,__offset);
                }
                else {
                  this->fInputText->chunkOffset = (int32_t)lVar5;
                }
              }
              if (lStack_38 <= __offset) {
                this->fMatch = '\0';
                this->fHitEnd = '\x01';
                return '\0';
              }
              if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
                 ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] < 0xd800))
              {
                pUVar2 = this->fInputText->chunkContents;
                iVar6 = this->fInputText->chunkOffset;
                this->fInputText->chunkOffset = iVar6 + 1;
                local_108 = (uint)(ushort)pUVar2[iVar6];
              }
              else {
                local_108 = utext_next32_63(this->fInputText);
              }
              __offset_6._4_4_ = local_108;
              if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
                local_110 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
              }
              else {
                local_110 = this->fInputText->chunkNativeStart + (long)this->fInputText->chunkOffset
                ;
              }
              __offset = local_110;
              UVar4 = findProgressInterrupt(this,local_110,status);
            } while (UVar4 == '\0');
            this_local._7_1_ = '\0';
          }
          break;
        default:
          this_local._7_1_ = '\0';
        }
      }
    }
    else {
      *status = this->fDeferredStatus;
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool RegexMatcher::find(UErrorCode &status) {
    // Start at the position of the last match end.  (Will be zero if the
    //   matcher has been reset.)
    //
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return FALSE;
    }

    if (UTEXT_FULL_TEXT_IN_CHUNK(fInputText, fInputLength)) {
        return findUsingChunk(status);
    }

    int64_t startPos = fMatchEnd;
    if (startPos==0) {
        startPos = fActiveStart;
    }

    if (fMatch) {
        // Save the position of any previous successful match.
        fLastMatchEnd = fMatchEnd;

        if (fMatchStart == fMatchEnd) {
            // Previous match had zero length.  Move start position up one position
            //  to avoid sending find() into a loop on zero-length matches.
            if (startPos >= fActiveLimit) {
                fMatch = FALSE;
                fHitEnd = TRUE;
                return FALSE;
            }
            UTEXT_SETNATIVEINDEX(fInputText, startPos);
            (void)UTEXT_NEXT32(fInputText);
            startPos = UTEXT_GETNATIVEINDEX(fInputText);
        }
    } else {
        if (fLastMatchEnd >= 0) {
            // A previous find() failed to match.  Don't try again.
            //   (without this test, a pattern with a zero-length match
            //    could match again at the end of an input string.)
            fHitEnd = TRUE;
            return FALSE;
        }
    }


    // Compute the position in the input string beyond which a match can not begin, because
    //   the minimum length match would extend past the end of the input.
    //   Note:  some patterns that cannot match anything will have fMinMatchLength==Max Int.
    //          Be aware of possible overflows if making changes here.
    int64_t testStartLimit;
    if (UTEXT_USES_U16(fInputText)) {
        testStartLimit = fActiveLimit - fPattern->fMinMatchLen;
        if (startPos > testStartLimit) {
            fMatch = FALSE;
            fHitEnd = TRUE;
            return FALSE;
        }
    } else {
        // We don't know exactly how long the minimum match length is in native characters.
        // Treat anything > 0 as 1.
        testStartLimit = fActiveLimit - (fPattern->fMinMatchLen > 0 ? 1 : 0);
    }

    UChar32  c;
    U_ASSERT(startPos >= 0);

    switch (fPattern->fStartType) {
    case START_NO_INFO:
        // No optimization was found.
        //  Try a match at each input position.
        for (;;) {
            MatchAt(startPos, FALSE, status);
            if (U_FAILURE(status)) {
                return FALSE;
            }
            if (fMatch) {
                return TRUE;
            }
            if (startPos >= testStartLimit) {
                fHitEnd = TRUE;
                return FALSE;
            }
            UTEXT_SETNATIVEINDEX(fInputText, startPos);
            (void)UTEXT_NEXT32(fInputText);
            startPos = UTEXT_GETNATIVEINDEX(fInputText);
            // Note that it's perfectly OK for a pattern to have a zero-length
            //   match at the end of a string, so we must make sure that the loop
            //   runs with startPos == testStartLimit the last time through.
            if  (findProgressInterrupt(startPos, status))
                return FALSE;
        }
        U_ASSERT(FALSE);

    case START_START:
        // Matches are only possible at the start of the input string
        //   (pattern begins with ^ or \A)
        if (startPos > fActiveStart) {
            fMatch = FALSE;
            return FALSE;
        }
        MatchAt(startPos, FALSE, status);
        if (U_FAILURE(status)) {
            return FALSE;
        }
        return fMatch;


    case START_SET:
        {
            // Match may start on any char from a pre-computed set.
            U_ASSERT(fPattern->fMinMatchLen > 0);
            UTEXT_SETNATIVEINDEX(fInputText, startPos);
            for (;;) {
                int64_t pos = startPos;
                c = UTEXT_NEXT32(fInputText);
                startPos = UTEXT_GETNATIVEINDEX(fInputText);
                // c will be -1 (U_SENTINEL) at end of text, in which case we
                // skip this next block (so we don't have a negative array index)
                // and handle end of text in the following block.
                if (c >= 0 && ((c<256 && fPattern->fInitialChars8->contains(c)) ||
                              (c>=256 && fPattern->fInitialChars->contains(c)))) {
                    MatchAt(pos, FALSE, status);
                    if (U_FAILURE(status)) {
                        return FALSE;
                    }
                    if (fMatch) {
                        return TRUE;
                    }
                    UTEXT_SETNATIVEINDEX(fInputText, pos);
                }
                if (startPos > testStartLimit) {
                    fMatch = FALSE;
                    fHitEnd = TRUE;
                    return FALSE;
                }
                if  (findProgressInterrupt(startPos, status))
                    return FALSE;
            }
        }
        U_ASSERT(FALSE);

    case START_STRING:
    case START_CHAR:
        {
            // Match starts on exactly one char.
            U_ASSERT(fPattern->fMinMatchLen > 0);
            UChar32 theChar = fPattern->fInitialChar;
            UTEXT_SETNATIVEINDEX(fInputText, startPos);
            for (;;) {
                int64_t pos = startPos;
                c = UTEXT_NEXT32(fInputText);
                startPos = UTEXT_GETNATIVEINDEX(fInputText);
                if (c == theChar) {
                    MatchAt(pos, FALSE, status);
                    if (U_FAILURE(status)) {
                        return FALSE;
                    }
                    if (fMatch) {
                        return TRUE;
                    }
                    UTEXT_SETNATIVEINDEX(fInputText, startPos);
                }
                if (startPos > testStartLimit) {
                    fMatch = FALSE;
                    fHitEnd = TRUE;
                    return FALSE;
                }
                if  (findProgressInterrupt(startPos, status))
                    return FALSE;
           }
        }
        U_ASSERT(FALSE);

    case START_LINE:
        {
            UChar32 ch;
            if (startPos == fAnchorStart) {
                MatchAt(startPos, FALSE, status);
                if (U_FAILURE(status)) {
                    return FALSE;
                }
                if (fMatch) {
                    return TRUE;
                }
                UTEXT_SETNATIVEINDEX(fInputText, startPos);
                ch = UTEXT_NEXT32(fInputText);
                startPos = UTEXT_GETNATIVEINDEX(fInputText);
            } else {
                UTEXT_SETNATIVEINDEX(fInputText, startPos);
                ch = UTEXT_PREVIOUS32(fInputText);
                UTEXT_SETNATIVEINDEX(fInputText, startPos);
            }

            if (fPattern->fFlags & UREGEX_UNIX_LINES) {
                for (;;) {
                    if (ch == 0x0a) {
                            MatchAt(startPos, FALSE, status);
                            if (U_FAILURE(status)) {
                                return FALSE;
                            }
                            if (fMatch) {
                                return TRUE;
                            }
                            UTEXT_SETNATIVEINDEX(fInputText, startPos);
                    }
                    if (startPos >= testStartLimit) {
                        fMatch = FALSE;
                        fHitEnd = TRUE;
                        return FALSE;
                    }
                    ch = UTEXT_NEXT32(fInputText);
                    startPos = UTEXT_GETNATIVEINDEX(fInputText);
                    // Note that it's perfectly OK for a pattern to have a zero-length
                    //   match at the end of a string, so we must make sure that the loop
                    //   runs with startPos == testStartLimit the last time through.
                    if  (findProgressInterrupt(startPos, status))
                        return FALSE;
                }
            } else {
                for (;;) {
                    if (isLineTerminator(ch)) {
                        if (ch == 0x0d && startPos < fActiveLimit && UTEXT_CURRENT32(fInputText) == 0x0a) {
                            (void)UTEXT_NEXT32(fInputText);
                            startPos = UTEXT_GETNATIVEINDEX(fInputText);
                        }
                        MatchAt(startPos, FALSE, status);
                        if (U_FAILURE(status)) {
                            return FALSE;
                        }
                        if (fMatch) {
                            return TRUE;
                        }
                        UTEXT_SETNATIVEINDEX(fInputText, startPos);
                    }
                    if (startPos >= testStartLimit) {
                        fMatch = FALSE;
                        fHitEnd = TRUE;
                        return FALSE;
                    }
                    ch = UTEXT_NEXT32(fInputText);
                    startPos = UTEXT_GETNATIVEINDEX(fInputText);
                    // Note that it's perfectly OK for a pattern to have a zero-length
                    //   match at the end of a string, so we must make sure that the loop
                    //   runs with startPos == testStartLimit the last time through.
                    if  (findProgressInterrupt(startPos, status))
                        return FALSE;
                }
            }
        }

    default:
        U_ASSERT(FALSE);
    }

    U_ASSERT(FALSE);
    return FALSE;
}